

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderStructTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::ShaderStructCase::ShaderStructCase
          (ShaderStructCase *this,Context *context,char *name,char *description,bool isVertexCase,
          deUint32 flags,ShaderEvalFunc evalFunc,SetupUniformsFunc setupUniformsFunc,
          char *vertShaderSource,char *fragShaderSource)

{
  TestContext *testCtx;
  RenderContext *renderCtx;
  ContextInfo *ctxInfo;
  deUint32 flags_local;
  bool isVertexCase_local;
  char *description_local;
  char *name_local;
  Context *context_local;
  ShaderStructCase *this_local;
  
  testCtx = Context::getTestContext(context);
  renderCtx = Context::getRenderContext(context);
  ctxInfo = Context::getContextInfo(context);
  deqp::gls::ShaderRenderCase::ShaderRenderCase
            (&this->super_ShaderRenderCase,testCtx,renderCtx,ctxInfo,name,description,isVertexCase,
             evalFunc);
  (this->super_ShaderRenderCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderStructCase_00cac168;
  this->m_setupUniforms = setupUniformsFunc;
  this->m_flags = flags;
  this->m_brickTexture = (Texture2D *)0x0;
  std::__cxx11::string::operator=
            ((string *)&(this->super_ShaderRenderCase).m_vertShaderSource,vertShaderSource);
  std::__cxx11::string::operator=
            ((string *)&(this->super_ShaderRenderCase).m_fragShaderSource,fragShaderSource);
  return;
}

Assistant:

ShaderStructCase::ShaderStructCase (Context& context, const char* name, const char* description, bool isVertexCase, deUint32 flags, ShaderEvalFunc evalFunc, SetupUniformsFunc setupUniformsFunc, const char* vertShaderSource, const char* fragShaderSource)
	: ShaderRenderCase	(context.getTestContext(), context.getRenderContext(), context.getContextInfo(), name, description, isVertexCase, evalFunc)
	, m_setupUniforms	(setupUniformsFunc)
	, m_flags			(flags)
	, m_brickTexture	(DE_NULL)
{
	m_vertShaderSource	= vertShaderSource;
	m_fragShaderSource	= fragShaderSource;
}